

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

int wwCmpW(word *a,size_t n,word w)

{
  bool_t bVar1;
  ulong in_RDX;
  long in_RSI;
  ulong *in_RDI;
  int z;
  int ret;
  uint local_1c;
  
  if (in_RSI == 0) {
    local_1c = (in_RDX == 0) - 1;
  }
  else {
    bVar1 = wwIsZero(in_RDI + 1,in_RSI - 1);
    local_1c = -bVar1 & (-(uint)(*in_RDI < in_RDX) | -(uint)(in_RDX < *in_RDI) & 1) | bVar1 - 1U & 1
    ;
  }
  return local_1c;
}

Assistant:

int SAFE(wwCmpW)(const word a[], size_t n, register word w)
{
	register int ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0) - 1;
	else
	{
		register int z = wwIsZero(a + 1, n - 1);
		ret = -wordLess(a[0], w) & -1 | -wordGreater(a[0], w) & 1;
		ret = -z & ret | (z - 1) & 1;
		z = 0;
	}
	w = 0;
	return ret;
}